

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTypes.h
# Opt level: O2

void __thiscall cmNinjaRule::cmNinjaRule(cmNinjaRule *this,string *name)

{
  std::__cxx11::string::string((string *)this,(string *)name);
  (this->Command)._M_dataplus._M_p = (pointer)&(this->Command).field_2;
  (this->Command)._M_string_length = 0;
  (this->Command).field_2._M_local_buf[0] = '\0';
  (this->Description)._M_dataplus._M_p = (pointer)&(this->Description).field_2;
  (this->Description)._M_string_length = 0;
  (this->Description).field_2._M_local_buf[0] = '\0';
  (this->Comment)._M_dataplus._M_p = (pointer)&(this->Comment).field_2;
  (this->Comment)._M_string_length = 0;
  (this->Comment).field_2._M_local_buf[0] = '\0';
  (this->DepFile)._M_dataplus._M_p = (pointer)&(this->DepFile).field_2;
  (this->DepFile)._M_string_length = 0;
  (this->DepFile).field_2._M_local_buf[0] = '\0';
  (this->DepType)._M_dataplus._M_p = (pointer)&(this->DepType).field_2;
  (this->DepType)._M_string_length = 0;
  (this->DepType).field_2._M_local_buf[0] = '\0';
  (this->RspFile)._M_dataplus._M_p = (pointer)&(this->RspFile).field_2;
  (this->RspFile)._M_string_length = 0;
  (this->RspFile).field_2._M_local_buf[0] = '\0';
  (this->RspContent)._M_dataplus._M_p = (pointer)&(this->RspContent).field_2;
  (this->RspContent)._M_string_length = 0;
  (this->RspContent).field_2._M_local_buf[0] = '\0';
  (this->Restat)._M_dataplus._M_p = (pointer)&(this->Restat).field_2;
  (this->Restat)._M_string_length = 0;
  (this->Restat).field_2._M_local_buf[0] = '\0';
  this->Generator = false;
  return;
}

Assistant:

cmNinjaRule(std::string name)
    : Name(std::move(name))
  {
  }